

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

Data128 Centaurus::pack_charclass(CharClass<wchar_t> *cc)

{
  bool bVar1;
  wchar_t wVar2;
  undefined1 local_68 [16];
  CharClass<wchar_t> local_58;
  undefined1 local_38 [28];
  int i;
  CharClass<wchar_t> *cc_local;
  Data128 d128;
  
  unique0x1000019a = cc;
  for (local_38._20_4_ = 0; (int)local_38._20_4_ < 4; local_38._20_4_ = local_38._20_4_ + 1) {
    CharClass<wchar_t>::operator[]((CharClass<wchar_t> *)local_38,(int)stack0xffffffffffffffe0);
    bVar1 = Range<wchar_t>::empty((Range<wchar_t> *)local_38);
    Range<wchar_t>::~Range((Range<wchar_t> *)local_38);
    if (bVar1) {
      *(undefined2 *)((long)&cc_local + (long)(int)(local_38._20_4_ << 1) * 2) = 0xffff;
      *(undefined2 *)((long)&cc_local + (long)(local_38._20_4_ * 2 + 1) * 2) = 0;
    }
    else {
      CharClass<wchar_t>::operator[]
                ((CharClass<wchar_t> *)(local_68 + 0x10),(int)stack0xffffffffffffffe0);
      wVar2 = Range<wchar_t>::start((Range<wchar_t> *)(local_68 + 0x10));
      *(short *)((long)&cc_local + (long)(local_38._20_4_ * 2) * 2) = (short)wVar2;
      Range<wchar_t>::~Range((Range<wchar_t> *)(local_68 + 0x10));
      CharClass<wchar_t>::operator[]((CharClass<wchar_t> *)local_68,(int)stack0xffffffffffffffe0);
      wVar2 = Range<wchar_t>::end((Range<wchar_t> *)local_68);
      *(short *)((long)&cc_local + (long)(local_38._20_4_ * 2 + 1) * 2) = (short)wVar2 + -1;
      Range<wchar_t>::~Range((Range<wchar_t> *)local_68);
    }
  }
  return _cc_local;
}

Assistant:

static asmjit::Data128 pack_charclass(const CharClass<wchar_t>& cc)
{
    asmjit::Data128 d128;

    for (int i = 0; i < 4; i++)
    {
        if (cc[i].empty())
        {
            d128.uw[i * 2 + 0] = 0xFFFF;
            d128.uw[i * 2 + 1] = 0;
        }
        else
        {
            d128.uw[i * 2 + 0] = cc[i].start();
            d128.uw[i * 2 + 1] = cc[i].end() - 1;
        }
    }

    return d128;
}